

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O0

void SubVerifyBase<unsigned_long,unsigned_long>(char *types)

{
  bool bVar1;
  char *pcVar2;
  string msg_2;
  unsigned_long x;
  string msg_1;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  unsigned_long ret;
  TestCase<unsigned_long,_unsigned_long,_4> test;
  TestVector<unsigned_long,_unsigned_long,_4> tests;
  unsigned_long in_stack_fffffffffffffd98;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffda0;
  allocator *in_stack_fffffffffffffda8;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffdb0;
  unsigned_long local_210;
  byte local_200;
  allocator local_1f1;
  string local_1f0 [15];
  undefined1 in_stack_fffffffffffffe1f;
  unsigned_long in_stack_fffffffffffffe20;
  unsigned_long in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_168;
  unsigned_long local_160;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_c8;
  byte local_ba;
  allocator local_b9;
  string local_b8 [55];
  allocator local_81;
  string local_80 [32];
  string local_60 [40];
  unsigned_long local_38;
  unsigned_long local_30;
  byte local_28;
  TestVector<unsigned_long,_unsigned_long,_4> local_20;
  
  TestVector<unsigned_long,_unsigned_long,_4>::TestVector(&local_20);
  TestVector<unsigned_long,_unsigned_long,_4>::GetNext
            ((TestVector<unsigned_long,_unsigned_long,_4> *)in_stack_fffffffffffffdb0.m_int);
  while( true ) {
    bVar1 = TestVector<unsigned_long,_unsigned_long,_4>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeSubtract<unsigned_long,unsigned_long>
                      ((unsigned_long)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                       (unsigned_long *)0x1b4116);
    if (bVar1 != (bool)(local_28 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"Error in case ",&local_81);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,pcVar2,&local_b9);
      err_msg<unsigned_long,unsigned_long>
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (bool)in_stack_fffffffffffffe1f);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      std::__cxx11::string::~string(local_60);
    }
    local_ba = 1;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_c8,&local_38);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator-=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    if ((local_ba & 1) != (local_28 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"Error in case ",&local_129);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,pcVar2,&local_151);
      err_msg<unsigned_long,unsigned_long>
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (bool)in_stack_fffffffffffffe1f);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      std::__cxx11::string::~string(local_e8);
    }
    local_ba = 1;
    local_160 = local_38;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_168,&local_30);
    operator-=((unsigned_long *)in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
    if ((local_ba & 1) != (local_28 & 1)) {
      in_stack_fffffffffffffdb0.m_int = (unsigned_long)&stack0xfffffffffffffe37;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1c8,"Error in case ",(allocator *)in_stack_fffffffffffffdb0.m_int);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_1a8);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
      in_stack_fffffffffffffda0 =
           (SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffda8 = &local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1f0,(char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
      err_msg<unsigned_long,unsigned_long>
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (bool)in_stack_fffffffffffffe1f);
      std::__cxx11::string::~string(local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      std::__cxx11::string::~string(local_188);
    }
    TestVector<unsigned_long,_unsigned_long,_4>::GetNext
              ((TestVector<unsigned_long,_unsigned_long,_4> *)in_stack_fffffffffffffdb0.m_int);
    local_38 = local_210;
    local_28 = local_200;
  }
  return;
}

Assistant:

void SubVerifyBase(const char* types)
{
    TestVector< T, U, OpType::Sub > tests;
    TestCase< T, U, OpType::Sub > test = tests.GetNext();

    while (!tests.Done())
    {
        T ret;
        if (SafeSubtract(test.x, test.y, ret) != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types;
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Now test throwing version
        bool fSuccess = true;
        try
        {
            SafeInt<T> si(test.x);
            si -= test.y;
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (1): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Also need to test the version that assigns back out
        // to a plain int, as it has different logic
        fSuccess = true;
        try
        {
            T x(test.x);
            x -= SafeInt<U>(test.y);
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (2): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        test = tests.GetNext();
    }
}